

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

void helper_ljmp_protected_x86_64
               (CPUX86State *env,int new_cs,target_ulong new_eip,target_ulong next_eip)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  int exception_index;
  uint uVar10;
  abi_ptr aVar11;
  uint uVar12;
  uint uVar13;
  uintptr_t unaff_retaddr;
  
  uVar4 = new_cs & 0xfffc;
  if (uVar4 == 0) {
LAB_00517cfd:
    exception_index = 0xd;
    uVar4 = 0;
    goto LAB_00517d2e;
  }
  lVar7 = 0x148;
  if ((new_cs & 4U) == 0) {
    lVar7 = 0x178;
  }
  if (*(uint *)((long)env->regs + lVar7 + 0x10) < (new_cs | 7U)) {
    exception_index = 0xd;
    goto LAB_00517d2e;
  }
  uVar12 = 2;
  uVar5 = 2;
  aVar11 = (long)(int)(new_cs & 0xfffffff8) + *(long *)((long)env->regs + lVar7 + 8);
  if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
    uVar5 = (uint)env->eflags >> 0x11 & 2;
  }
  uVar1 = cpu_ldl_mmuidx_ra_x86_64(env,aVar11,uVar5,unaff_retaddr);
  if (((env->hflags >> 0x17 & 1) != 0) && (uVar12 = 0, (~env->hflags & 3) != 0)) {
    uVar12 = (uint)env->eflags >> 0x11 & 2;
  }
  uVar12 = cpu_ldl_mmuidx_ra_x86_64(env,aVar11 + 4,uVar12,unaff_retaddr);
  uVar5 = env->hflags;
  uVar13 = uVar5 & 3;
  if ((uVar12 >> 0xc & 1) == 0) {
    uVar9 = uVar12 >> 8 & 0xf;
    uVar6 = (uint)env->efer;
    if ((uVar9 == 0xc || (uVar6 >> 10 & 1) == 0) && (uVar9 < 0xd)) {
      uVar10 = uVar12 >> 0xd & 3;
      if ((0x222U >> uVar9 & 1) == 0) {
        if ((((0x1010U >> uVar9 & 1) != 0) && (uVar13 <= uVar10)) && ((new_cs & 3U) <= uVar10)) {
          if (-1 < (short)uVar12) goto LAB_00517d22;
          uVar10 = 0;
          if (uVar9 == 0xc) {
            uVar10 = uVar12 & 0xffff0000;
          }
          uVar10 = uVar10 | uVar1 & 0xffff;
          new_eip = (target_ulong)uVar10;
          if ((uVar6 >> 10 & 1) == 0) {
LAB_00517ab7:
            uVar4 = uVar1 >> 0x10;
            lVar7 = 0x148;
            if ((uVar1 >> 0x12 & 1) == 0) {
              lVar7 = 0x178;
            }
            if ((uVar4 | 7) <= *(uint *)((long)env->regs + lVar7 + 0x10)) {
              uVar12 = 2;
              uVar5 = 2;
              aVar11 = (ulong)(uVar4 & 0xfffffff8) + *(long *)((long)env->regs + lVar7 + 8);
              if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
                uVar5 = (uint)env->eflags >> 0x11 & 2;
              }
              uVar1 = cpu_ldl_mmuidx_ra_x86_64(env,aVar11,uVar5,unaff_retaddr);
              if (((env->hflags >> 0x17 & 1) != 0) && (uVar12 = 0, (~env->hflags & 3) != 0)) {
                uVar12 = (uint)env->eflags >> 0x11 & 2;
              }
              uVar12 = cpu_ldl_mmuidx_ra_x86_64(env,aVar11 + 4,uVar12,unaff_retaddr);
              if ((~uVar12 & 0x1800) == 0) {
                uVar5 = uVar12 >> 0xd & 3;
                bVar8 = uVar5 <= uVar13;
                if ((uVar12 >> 10 & 1) == 0) {
                  bVar8 = uVar5 == uVar13;
                }
                if ((bVar8) &&
                   ((((env->efer & 0x400) == 0 ||
                     (((uVar12 >> 0x15 & 1) != 0 && ((uVar12 >> 0x16 & 1) == 0)))) &&
                    ((short)uVar12 < 0)))) {
                  uVar5 = uVar12 & 0xf0000 | uVar1 & 0xffff;
                  uVar6 = uVar5 << 0xc | 0xfff;
                  if ((uVar12 >> 0x17 & 1) == 0) {
                    uVar6 = uVar5;
                  }
                  uVar5 = env->hflags;
                  if (uVar6 < new_eip) {
                    if (((uVar12 >> 0x15 & 1) == 0) || ((uVar5 & 0x4000) == 0)) goto LAB_00517cfd;
                    bVar8 = false;
                  }
                  else {
                    bVar8 = (uVar12 >> 0x15 & 1) == 0 || (uVar5 >> 0xe & 1) == 0;
                  }
                  uVar4 = uVar4 & 0xfffffffc;
                  uVar9 = uVar12 & 0xff000000 | uVar1 >> 0x10;
                  goto LAB_00517c41;
                }
              }
            }
            uVar4 = uVar4 & 0xfffffffc;
            exception_index = 0xd;
            goto LAB_00517d2e;
          }
          if ((new_cs + 8U | 7) <= *(uint *)((long)env->regs + lVar7 + 0x10)) {
            uVar12 = 2;
            aVar11 = (long)(int)(new_cs + 8U & 0xfffffff8) + *(long *)((long)env->regs + lVar7 + 8);
            if (((uVar5 >> 0x17 & 1) != 0) && (uVar12 = 0, uVar13 != 3)) {
              uVar12 = (uint)env->eflags >> 0x11 & 2;
            }
            uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,aVar11,uVar12,unaff_retaddr);
            uVar5 = 2;
            if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
              uVar5 = (uint)env->eflags >> 0x11 & 2;
            }
            uVar3 = cpu_ldl_mmuidx_ra_x86_64(env,aVar11 + 4,uVar5,unaff_retaddr);
            if ((uVar3 & 0x1f00) == 0) {
              new_eip = CONCAT44(uVar2,uVar10);
              goto LAB_00517ab7;
            }
          }
        }
      }
      else if ((uVar13 <= uVar10) && ((new_cs & 3U) <= uVar10)) {
        switch_tss_ra(env,new_cs,uVar1,uVar12,0,(uint32_t)next_eip,unaff_retaddr);
        return;
      }
    }
  }
  else if ((uVar12 >> 0xb & 1) != 0) {
    uVar6 = uVar12 >> 0xd & 3;
    if ((uVar12 >> 10 & 1) == 0) {
      if (((new_cs & 3U) <= uVar13) && (uVar6 == uVar13)) {
LAB_00517947:
        if ((short)uVar12 < 0) {
          uVar9 = uVar12 & 0xf0000 | uVar1 & 0xffff;
          uVar6 = uVar9 << 0xc | 0xfff;
          if ((uVar12 >> 0x17 & 1) == 0) {
            uVar6 = uVar9;
          }
          if (uVar6 < new_eip) {
            if (((uVar12 >> 0x15 & 1) == 0) || ((uVar5 & 0x4000) == 0)) goto LAB_00517cfd;
            bVar8 = false;
          }
          else {
            bVar8 = (uVar12 >> 0x15 & 1) == 0 || (uVar5 >> 0xe & 1) == 0;
          }
          uVar9 = uVar12 & 0xff000000 | uVar1 >> 0x10;
LAB_00517c41:
          env->segs[1].selector = uVar13 | uVar4;
          env->segs[1].base = (ulong)(uVar9 | (uVar12 & 0xff) << 0x10);
          env->segs[1].limit = uVar6;
          env->segs[1].flags = uVar12;
          if (bVar8) {
            uVar4 = uVar5 & 0xffff7fef | uVar12 >> 0x12 & 0x10;
          }
          else {
            uVar4 = uVar5 & 0xffff7f8f | 0x8030;
          }
          uVar5 = env->segs[2].flags >> 0x11 & 0x20;
          if (-1 < (short)uVar4) {
            if ((((env->cr[0] & 1) == 0) || ((uVar4 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)
               ) {
              uVar5 = uVar5 | 0x40;
            }
            else {
              uVar5 = uVar5 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                    env->segs[2].base != 0) << 6;
            }
          }
          env->hflags = uVar4 & 0xffffff9f | uVar5;
          env->eip = new_eip;
          return;
        }
LAB_00517d22:
        exception_index = 0xb;
        goto LAB_00517d2e;
      }
    }
    else if (uVar6 <= uVar13) goto LAB_00517947;
  }
  exception_index = 0xd;
LAB_00517d2e:
  raise_exception_err_ra_x86_64(env,exception_index,uVar4,unaff_retaddr);
}

Assistant:

void helper_ljmp_protected(CPUX86State *env, int new_cs, target_ulong new_eip,
                           target_ulong next_eip)
{
    int gate_cs, type;
    uint32_t e1, e2, cpl, dpl, rpl, limit;

    if ((new_cs & 0xfffc) == 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
    if (load_segment_ra(env, &e1, &e2, new_cs, GETPC()) != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
    }
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if (!(e2 & DESC_CS_MASK)) {
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
        }
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (e2 & DESC_C_MASK) {
            /* conforming code segment */
            if (dpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        } else {
            /* non conforming code segment */
            rpl = new_cs & 3;
            if (rpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (dpl != cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
        }
        limit = get_seg_limit(e1, e2);
        if (new_eip > limit &&
            (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
            raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
        }
        cpu_x86_load_seg_cache(env, R_CS, (new_cs & 0xfffc) | cpl,
                       get_seg_base(e1, e2), limit, e2);
        env->eip = new_eip;
    } else {
        /* jump to call or task gate */
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        rpl = new_cs & 3;
        cpl = env->hflags & HF_CPL_MASK;
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;

#ifdef TARGET_X86_64
        if (env->efer & MSR_EFER_LMA) {
            if (type != 12) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
#endif
        switch (type) {
        case 1: /* 286 TSS */
        case 9: /* 386 TSS */
        case 5: /* task gate */
            if (dpl < cpl || dpl < rpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            switch_tss_ra(env, new_cs, e1, e2, SWITCH_TSS_JMP, next_eip, GETPC());
            break;
        case 4: /* 286 call gate */
        case 12: /* 386 call gate */
            if ((dpl < cpl) || (dpl < rpl)) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
            }
            gate_cs = e1 >> 16;
            new_eip = (e1 & 0xffff);
            if (type == 12) {
                new_eip |= (e2 & 0xffff0000);
            }

#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                /* load the upper 8 bytes of the 64-bit call gate */
                if (load_segment_ra(env, &e1, &e2, new_cs + 8, GETPC())) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                type = (e2 >> DESC_TYPE_SHIFT) & 0x1f;
                if (type != 0) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                new_eip |= ((target_ulong)e1) << 32;
            }
#endif

            if (load_segment_ra(env, &e1, &e2, gate_cs, GETPC()) != 0) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            dpl = (e2 >> DESC_DPL_SHIFT) & 3;
            /* must be code segment */
            if (((e2 & (DESC_S_MASK | DESC_CS_MASK)) !=
                 (DESC_S_MASK | DESC_CS_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            if (((e2 & DESC_C_MASK) && (dpl > cpl)) ||
                (!(e2 & DESC_C_MASK) && (dpl != cpl))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                if (!(e2 & DESC_L_MASK)) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
                if (e2 & DESC_B_MASK) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
            }
#endif
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            limit = get_seg_limit(e1, e2);
            if (new_eip > limit &&
                (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
            }
            cpu_x86_load_seg_cache(env, R_CS, (gate_cs & 0xfffc) | cpl,
                                   get_seg_base(e1, e2), limit, e2);
            env->eip = new_eip;
            break;
        default:
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            break;
        }
    }
}